

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::exceptions::exception::~exception(exception *this)

{
  exception *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__exception_0042f378;
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  std::exception::~exception(in_RDI);
  return;
}

Assistant:

explicit exception(std::string  message)
  : m_message(std::move(message))
  {
  }